

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O3

IGUIImageList * __thiscall
irr::gui::CGUIEnvironment::createImageList
          (CGUIEnvironment *this,ITexture *texture,dimension2d<int> imageSize,bool useAlphaChannel)

{
  int *piVar1;
  bool bVar2;
  CGUIImageList *this_00;
  _func_int *p_Var3;
  
  this_00 = (CGUIImageList *)operator_new(0x48);
  CGUIImageList::CGUIImageList(this_00,this->Driver);
  bVar2 = CGUIImageList::createImageList(this_00,texture,imageSize,useAlphaChannel);
  if (!bVar2) {
    p_Var3 = (this_00->super_IGUIImageList)._vptr_IGUIImageList[-3];
    piVar1 = (int *)(&(this_00->super_IGUIImageList).field_0x10 + (long)p_Var3);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      p_Var3 = (_func_int *)
               ((long)&(this_00->super_IGUIImageList)._vptr_IGUIImageList + (long)p_Var3);
      (**(code **)(*(long *)p_Var3 + 8))(p_Var3);
    }
    this_00 = (CGUIImageList *)0x0;
  }
  return &this_00->super_IGUIImageList;
}

Assistant:

IGUIImageList *CGUIEnvironment::createImageList(video::ITexture *texture,
		core::dimension2d<s32> imageSize, bool useAlphaChannel)
{
	CGUIImageList *imageList = new CGUIImageList(Driver);
	if (!imageList->createImageList(texture, imageSize, useAlphaChannel)) {
		imageList->drop();
		return 0;
	}

	return imageList;
}